

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

fdb_status fdb_close(fdb_file_handle *fhandle)

{
  wal_dirty_t wVar1;
  fdb_status fVar2;
  size_t sVar3;
  
  if (fhandle == (fdb_file_handle *)0x0) {
    fVar2 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    if (((((fhandle->root->config).auto_commit == true) &&
         (sVar3 = filemgr_get_ref_count(fhandle->root->file), sVar3 == 1)) &&
        (wVar1 = wal_get_dirty_status(fhandle->root->file), wVar1 == '\x01')) &&
       (fVar2 = fdb_commit(fhandle,'\x01'), fVar2 != FDB_RESULT_SUCCESS)) {
      return fVar2;
    }
    filemgr_fhandle_remove(fhandle->root->file,fhandle);
    fVar2 = _fdb_close_root(fhandle->root);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_file_handle_close_all(fhandle);
      fdb_file_handle_free(fhandle);
      fVar2 = FDB_RESULT_SUCCESS;
    }
    else {
      filemgr_fhandle_add(fhandle->root->file,fhandle);
    }
  }
  return fVar2;
}

Assistant:

LIBFDB_API
fdb_status fdb_close(fdb_file_handle *fhandle)
{
    if (!fhandle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_status fs;
    if (fhandle->root->config.auto_commit &&
        filemgr_get_ref_count(fhandle->root->file) == 1) {
        // auto commit mode & the last handle referring the file
        // commit file before close only if WAL has unflushed data..
        if (wal_get_dirty_status(fhandle->root->file) == FDB_WAL_DIRTY) {
            // Since auto-commit ensures WAL flushed commit, if WAL is dirty
            // then it means that there is uncommitted data present
            fs = fdb_commit(fhandle, FDB_COMMIT_MANUAL_WAL_FLUSH);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }
        }
    }

    filemgr_fhandle_remove(fhandle->root->file, fhandle);
    fs = _fdb_close_root(fhandle->root);
    if (fs == FDB_RESULT_SUCCESS) {
        fdb_file_handle_close_all(fhandle);
        fdb_file_handle_free(fhandle);
    } else {
        filemgr_fhandle_add(fhandle->root->file, fhandle);
    }
    return fs;
}